

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O2

int uv_rwlock_tryrdlock(uv_rwlock_t *rwlock)

{
  int iVar1;
  
  iVar1 = pthread_rwlock_tryrdlock((pthread_rwlock_t *)rwlock);
  if (iVar1 != 0) {
    if ((iVar1 != 0xb) && (iVar1 != 0x10)) {
      abort();
    }
    iVar1 = -0x10;
  }
  return iVar1;
}

Assistant:

int uv_rwlock_tryrdlock(uv_rwlock_t* rwlock) {
  int err;

  err = pthread_rwlock_tryrdlock(rwlock);
  if (err) {
    if (err != EBUSY && err != EAGAIN)
      abort();
    return UV_EBUSY;
  }

  return 0;
}